

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  Module *this_00;
  pointer pGVar1;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_60;
  Global *local_58;
  Global *global;
  undefined1 local_30 [8];
  __single_object field;
  bool mutable__local;
  Index index_local;
  BinaryReaderIR *this_local;
  Type type_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._3_1_ = mutable_;
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&global,this);
  std::make_unique<wabt::GlobalModuleField,wabt::Location>((Location *)local_30);
  pGVar1 = std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
           operator->((unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)local_30);
  local_58 = &pGVar1->global;
  (pGVar1->global).type = type;
  (pGVar1->global).mutable_ =
       (bool)(field._M_t.
              super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
              .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._3_1_ & 1);
  this_00 = this->module_;
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  unique_ptr(&local_60,
             (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> *)
             local_30);
  Module::AppendField(this_00,&local_60);
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  ~unique_ptr(&local_60);
  Result::Result((Result *)&type_local,Ok);
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> *)
              local_30);
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = std::make_unique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}